

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O3

int32_t __thiscall
icu_63::DayPeriodRules::getStartHourForDayPeriod
          (DayPeriodRules *this,DayPeriod dayPeriod,UErrorCode *errorCode)

{
  int32_t i;
  uint uVar2;
  ulong uVar1;
  
  uVar1 = 0xffffffff;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (dayPeriod == DAYPERIOD_MIDNIGHT) {
      return 0;
    }
    if (dayPeriod == DAYPERIOD_NOON) {
      return 0xc;
    }
    if ((this->fDayPeriodForHour[0] == dayPeriod) && (this->fDayPeriodForHour[0x17] == dayPeriod)) {
      uVar1 = 0x17;
      do {
        uVar2 = (int)uVar1 - 1;
        if (this->fDayPeriodForHour[uVar2] != dayPeriod) goto LAB_002cc9ac;
        uVar1 = (ulong)uVar2;
      } while (1 < uVar2);
    }
    else {
      uVar1 = 0;
      do {
        if (this->fDayPeriodForHour[uVar1] == dayPeriod) goto LAB_002cc9ac;
        uVar1 = uVar1 + 1;
      } while (uVar1 != 0x18);
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
  }
LAB_002cc9ac:
  return (int32_t)uVar1;
}

Assistant:

int32_t DayPeriodRules::getStartHourForDayPeriod(
        DayPeriodRules::DayPeriod dayPeriod, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) { return -1; }

    if (dayPeriod == DAYPERIOD_MIDNIGHT) { return 0; }
    if (dayPeriod == DAYPERIOD_NOON) { return 12; }

    if (fDayPeriodForHour[0] == dayPeriod && fDayPeriodForHour[23] == dayPeriod) {
        // dayPeriod wraps around midnight. Start hour is later than end hour.
        for (int32_t i = 22; i >= 1; --i) {
            if (fDayPeriodForHour[i] != dayPeriod) {
                return (i + 1);
            }
        }
    } else {
        for (int32_t i = 0; i <= 23; ++i) {
            if (fDayPeriodForHour[i] == dayPeriod) {
                return i;
            }
        }
    }

    // dayPeriod doesn't exist in rule set; set error and exit.
    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
}